

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void __thiscall Assimp::XFileExporter::WriteFrameTransform(XFileExporter *this,aiMatrix4x4 *m)

{
  ostream *poVar1;
  aiMatrix4x4 *m_local;
  XFileExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"FrameTransformMatrix {");
  poVar1 = std::operator<<(poVar1,(string *)&this->endstr);
  std::operator<<(poVar1," ");
  PushTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->a1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->b1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->c1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->d1);
  poVar1 = std::operator<<(poVar1,",");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->a2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->b2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->c2);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->d2);
  poVar1 = std::operator<<(poVar1,",");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->a3);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->b3);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->c3);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->d3);
  poVar1 = std::operator<<(poVar1,",");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->a4);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->b4);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->c4);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->d4);
  poVar1 = std::operator<<(poVar1,";;");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x18,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"}");
  poVar1 = std::operator<<(poVar1,(string *)&this->endstr);
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void XFileExporter::WriteFrameTransform(aiMatrix4x4& m)
{
    mOutput << startstr << "FrameTransformMatrix {" << endstr << " ";
    PushTag();
    mOutput << startstr << m.a1 << ", " << m.b1 << ", " << m.c1 << ", " << m.d1 << "," << endstr;
    mOutput << startstr << m.a2 << ", " << m.b2 << ", " << m.c2 << ", " << m.d2 << "," << endstr;
    mOutput << startstr << m.a3 << ", " << m.b3 << ", " << m.c3 << ", " << m.d3 << "," << endstr;
    mOutput << startstr << m.a4 << ", " << m.b4 << ", " << m.c4 << ", " << m.d4 << ";;" << endstr;
    PopTag();
    mOutput << startstr << "}" << endstr << endstr;
}